

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

int __thiscall
FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>
::size(FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>
       *this)

{
  int iVar1;
  
  iVar1 = FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>
          ::size(&this->right_->fadexpr_);
  return iVar1;
}

Assistant:

int size() const { return right_.size();}